

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_short_test.c
# Opt level: O0

void int_to_float_test(void)

{
  int local_10;
  uint local_c;
  int k;
  
  printf("\tint_to_float_test ............................... ");
  for (local_c = 0; (int)local_c < 10000; local_c = local_c + 1) {
    int_to_float_test::input[(int)local_c] = (local_c * -0x80000000) / 10000;
  }
  src_int_to_float_array(int_to_float_test::input,int_to_float_test::temp,10000);
  src_float_to_int_array(int_to_float_test::temp,int_to_float_test::output,10000);
  local_c = 0;
  while( true ) {
    if (9999 < (int)local_c) {
      puts("ok");
      return;
    }
    if (int_to_float_test::input[(int)local_c] - int_to_float_test::output[(int)local_c] < 0) {
      local_10 = -(int_to_float_test::input[(int)local_c] - int_to_float_test::output[(int)local_c])
      ;
    }
    else {
      local_10 = int_to_float_test::input[(int)local_c] - int_to_float_test::output[(int)local_c];
    }
    if (0 < local_10) break;
    local_c = local_c + 1;
  }
  printf("\n\n\tLine %d : index %d   %d -> %d\n",0xb8,(ulong)local_c,
         (ulong)(uint)int_to_float_test::input[(int)local_c],
         (ulong)(uint)int_to_float_test::output[(int)local_c]);
  exit(1);
}

Assistant:

static void
int_to_float_test (void)
{
	static int input	[BUFFER_LEN] ;
	static int output	[BUFFER_LEN] ;
	static float temp	[BUFFER_LEN] ;

	int k ;

	printf ("\tint_to_float_test ............................... ") ;

	for (k = 0 ; k < ARRAY_LEN (input) ; k++)
		input [k] = (k * 0x80000000) / ARRAY_LEN (input) ;

	src_int_to_float_array (input, temp, ARRAY_LEN (temp)) ;
	src_float_to_int_array (temp, output, ARRAY_LEN (output)) ;

	for (k = 0 ; k < ARRAY_LEN (input) ; k++)
		if (ABS (input [k] - output [k]) > 0)
		{	printf ("\n\n\tLine %d : index %d   %d -> %d\n", __LINE__, k, input [k], output [k]) ;
			exit (1) ;
			} ;

	puts ("ok") ;

	return ;
}